

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

int __thiscall
duckdb::Interpolator<true>::Extract<int,int>(Interpolator<true> *this,int *dest,Vector *result)

{
  uint input;
  bool bVar1;
  undefined1 auVar2 [12];
  int result_1;
  int local_3c;
  string local_38;
  
  input = *dest;
  bVar1 = TryCast::Operation<int,int>(input,&local_3c,false);
  if (bVar1) {
    return local_3c;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,int>(&local_38,(duckdb *)(ulong)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}